

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

void mwAbort(void)

{
  mwData **ppmVar1;
  uchar *puVar2;
  uchar uVar3;
  uint uVar4;
  mwMarker *pmVar5;
  int iVar6;
  uchar *ptr_1;
  size_t sVar7;
  __int32_t **pp_Var8;
  long lVar9;
  uint uVar10;
  mwData *pmVar11;
  char *pcVar12;
  ulong uVar13;
  mwStat *pmVar14;
  char cVar15;
  uchar *ptr;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  mwStat *pmVar19;
  bool bVar20;
  bool bVar21;
  time_t tid;
  time_t local_38;
  
  local_38 = time((time_t *)0x0);
  ctime(&local_38);
  mwWrite("\nStopped at %s\n");
  if (mwInited == 0) {
    mwWrite("internal: mwAbort(): MEMWATCH not initialized!\n");
  }
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  mwDrop_(0,0xfb,0);
  mwDrop_(0,0xfc,0);
  if (mwGrabList != (mwGrabData *)0x0) {
    mwWrite("internal: the grab list is not empty after mwDropAll()\n");
  }
  while (mwFirstMark != (mwMarker *)0x0) {
    pmVar5 = mwFirstMark->next;
    mwWrite("mark: %p: %s\n",mwFirstMark->host,mwFirstMark->text);
    free(mwFirstMark->text);
    free(mwFirstMark);
    mwErrors = mwErrors + 1;
    mwFirstMark = pmVar5;
  }
  mwFirstMark = (mwMarker *)0x0;
  if (mwHead != (mwData *)0x0) {
    bVar20 = true;
    uVar4 = 0;
    do {
      while (iVar6 = mwIsOwned(mwHead,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c"
                               ,0x230), iVar6 == 0) {
        mwWrite("internal: NML/unfreed scan restarting\n");
        mwFlush();
        bVar20 = uVar4 < 2;
        if ((mwHead == (mwData *)0x0) || (bVar21 = 1 < uVar4, uVar4 = uVar4 + 1, bVar21))
        goto LAB_0010643a;
      }
      mwFlushingB2 = 0;
      mwFlushingB1 = 0;
      mwFlushing = 0;
      if ((mwHead->flag & 1) == 0) {
        mwErrors = mwErrors + 1;
        pmVar11 = mwHead + 1;
        if (mwDataSize == '\0') {
          pmVar11 = mwHead;
        }
        ppmVar1 = &pmVar11->next;
        mwWrite("unfreed: <%ld> %s(%d), %ld bytes at %p ",mwHead->count,mwHead->file,
                (ulong)(uint)mwHead->line,mwHead->size,ppmVar1);
        lVar9 = 0;
        do {
          uVar3 = *(uchar *)((long)&pmVar11->prev + lVar9);
          puVar2 = "mEmwAtch" + lVar9;
          if (uVar3 != *puVar2) break;
          bVar21 = lVar9 != 7;
          lVar9 = lVar9 + 1;
        } while (bVar21);
        if (uVar3 != *puVar2) {
          mwWrite("[underflowed] ");
          mwFlush();
        }
        lVar9 = 0;
        do {
          uVar3 = *(uchar *)((long)ppmVar1 + lVar9 + mwHead->size);
          puVar2 = "mEmwAtch" + lVar9;
          if (uVar3 != *puVar2) break;
          bVar21 = lVar9 != 7;
          lVar9 = lVar9 + 1;
        } while (bVar21);
        if (uVar3 != *puVar2) {
          mwWrite("[overflowed] ");
          mwFlush();
        }
        mwWrite(" \t{");
        uVar16 = mwHead->size;
        uVar13 = 0x10;
        if (uVar16 < 0x10) {
          uVar13 = uVar16;
        }
        uVar17 = 0;
        do {
          if (uVar17 < uVar13) {
            mwWrite("%02X ",(ulong)*(byte *)((long)ppmVar1 + uVar17));
          }
          else {
            mwWrite(".. ");
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != 0x10);
        if (uVar16 != 0) {
          uVar16 = 0;
          do {
            uVar10 = *(byte *)((long)ppmVar1 + uVar16) - 0x7f;
            uVar17 = 0x2e;
            if (0xa0 < (byte)uVar10) {
              uVar17 = (ulong)*(byte *)((long)ppmVar1 + uVar16);
            }
            mwWrite("%c",(ulong)(uint)(int)(char)uVar17,(ulong)uVar10,uVar17);
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
        }
        mwWrite("}\n");
        pmVar11 = mwHead;
        mwUnlink(mwHead,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c",
                 0x25f);
      }
      else {
        pmVar11 = mwHead + 1;
        if (mwDataSize == '\0') {
          pmVar11 = mwHead;
        }
        iVar6 = (int)mwHead->size;
        if (iVar6 != 0) {
          lVar9 = 0;
          do {
            if (*(char *)((long)&pmVar11->next + lVar9) != -4) {
              mwErrors = mwErrors + 1;
              mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",mwHead->count,
                      &pmVar11->file,mwHead->file,(ulong)(uint)mwHead->line);
              mwFlush();
              break;
            }
            lVar9 = lVar9 + 1;
          } while (iVar6 != (int)lVar9);
        }
        pmVar11 = mwHead;
        mwNmlNumAlloc = mwNmlNumAlloc + -1;
        mwNmlCurAlloc = mwNmlCurAlloc - mwHead->size;
        mwUnlink(mwHead,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c",
                 0x26c);
      }
      free(pmVar11);
    } while ((bool)(mwHead != (mwData *)0x0 & bVar20));
  }
LAB_0010643a:
  if (mwNmlNumAlloc != 0) {
    mwWrite("internal: NoMansLand block counter %ld, not zero\n");
  }
  if (mwNmlCurAlloc != 0) {
    mwWrite("internal: NoMansLand byte counter %ld, not zero\n");
  }
  mwWrite("\nMemory usage statistics (global):\n");
  mwWrite(" N)umber of allocations made: %ld\n",mwStatNumAlloc);
  mwWrite(" L)argest memory usage      : %ld\n",mwStatMaxAlloc);
  mwWrite(" T)otal of all alloc() calls: %ld\n",mwStatTotAlloc);
  mwWrite(" U)nfreed bytes totals      : %ld\n",mwStatCurAlloc);
  mwFlush();
  if (0 < mwStatLevel) {
    mwWrite("\nMemory usage statistics (detailed):\n");
    mwWrite(" Module/Line                                Number   Largest  Total    Unfreed \n");
    for (pmVar14 = mwStatList; pmVar14 != (mwStat *)0x0; pmVar14 = pmVar14->next) {
      if (pmVar14->line == -1) {
        pcVar18 = "<unknown>";
        if (pmVar14->file != (char *)0x0) {
          iVar6 = mwIsReadAddr(pmVar14->file,0x16);
          pcVar18 = "<unknown>";
          if (iVar6 != 0) {
            pcVar18 = pmVar14->file;
          }
        }
        sVar7 = strlen(pcVar18);
        pcVar12 = pcVar18 + ((ulong)((uint)sVar7 & 0x7fffffff) - 0x2a);
        if ((int)(uint)sVar7 < 0x2b) {
          pcVar12 = pcVar18;
        }
        mwWrite(" %-42s %-8ld %-8ld %-8ld %-8ld\n",pcVar12,pmVar14->num,pmVar14->max,pmVar14->total,
                pmVar14->curr);
        pmVar19 = mwStatList;
        if ((mwStatList != (mwStat *)0x0 && pmVar14->file != (char *)0x0) && 1 < mwStatLevel) {
          do {
            uVar4 = pmVar19->line;
            if ((uVar4 != 0xffffffff) && (pcVar18 = pmVar19->file, pcVar18 != (char *)0x0)) {
              pcVar12 = pmVar14->file;
              if ((pcVar12 != (char *)0x0) && (cVar15 = *pcVar18, cVar15 != '\0')) {
                pp_Var8 = __ctype_toupper_loc();
                lVar9 = 0;
                do {
                  if ((*pp_Var8)[pcVar12[lVar9]] != (*pp_Var8)[cVar15]) goto LAB_00106616;
                  cVar15 = pcVar18[lVar9 + 1];
                  lVar9 = lVar9 + 1;
                } while (cVar15 != '\0');
              }
              mwWrite("  %-8d                                  %-8ld %-8ld %-8ld %-8ld\n",
                      (ulong)uVar4,pmVar19->num,pmVar19->max,pmVar19->total,pmVar19->curr);
            }
LAB_00106616:
            pmVar19 = pmVar19->next;
          } while (pmVar19 != (mwStat *)0x0);
        }
      }
    }
  }
  mwFlush();
  mwInited = 0;
  mwTail = (mwData *)0x0;
  mwHead = (mwData *)0x0;
  if (mwErrors != 0) {
    fprintf(_stderr,"MEMWATCH detected %ld anomalies\n");
  }
  mwLogFile((char *)0x0);
  mwErrors = 0;
  return;
}

Assistant:

void mwAbort(void)
{
	mwData *mw;
	mwMarker *mrk;
	char *data;
	time_t tid;
	int c, i, j;
	int errors;

	tid = time(NULL);
	mwWrite("\nStopped at %s\n", ctime(&tid));

	if (!mwInited) {
		mwWrite("internal: mwAbort(): MEMWATCH not initialized!\n");
	}

	/* release the grab list */
	mwDropAll();

	/* report mwMarked items */
	while (mwFirstMark) {
		mrk = mwFirstMark->next;
		mwWrite("mark: %p: %s\n", mwFirstMark->host, mwFirstMark->text);
		free(mwFirstMark->text);
		free(mwFirstMark);
		mwFirstMark = mrk;
		mwErrors ++;
	}

	/* release all still allocated memory */
	errors = 0;
	while (mwHead != NULL && errors < 3) {
		if (!mwIsOwned(mwHead, __FILE__, __LINE__)) {
			if (errors < 3) {
				errors ++;
				mwWrite("internal: NML/unfreed scan restarting\n");
				FLUSH();
				mwHead = mwHead;
				continue;
			}
			mwWrite("internal: NML/unfreed scan aborted, heap too damaged\n");
			FLUSH();
			break;
		}
		mwFlushW(0);
		if (!(mwHead->flag & MW_NML)) {
			mwErrors++;
			data = ((char *)mwHead) + mwDataSize;
			mwWrite("unfreed: <%ld> %s(%d), %ld bytes at %p ",
					mwHead->count, mwHead->file, mwHead->line, (long)mwHead->size, data + mwOverflowZoneSize);
			if (mwCheckOF(data)) {
				mwWrite("[underflowed] ");
				FLUSH();
			}
			if (mwCheckOF((data + mwOverflowZoneSize + mwHead->size))) {
				mwWrite("[overflowed] ");
				FLUSH();
			}
			mwWrite(" \t{");
			j = 16;
			if (mwHead->size < 16) {
				j = (int) mwHead->size;
			}
			for (i = 0; i < 16; i++) {
				if (i < j) mwWrite("%02X ",
									   (unsigned char) * (data + mwOverflowZoneSize + i));
				else {
					mwWrite(".. ");
				}
			}
			for (i = 0; i < j; i++) {
				c = *(data + mwOverflowZoneSize + i);
				if (c < 32 || c > 126) {
					c = '.';
				}
				mwWrite("%c", c);
			}
			mwWrite("}\n");
			mw = mwHead;
			mwUnlink(mw, __FILE__, __LINE__);
			free(mw);
		} else {
			data = ((char *)mwHead) + mwDataSize + mwOverflowZoneSize;
			if (mwTestMem(data, mwHead->size, MW_VAL_NML)) {
				mwErrors++;
				mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
						mwHead->count, data + mwOverflowZoneSize, mwHead->file, mwHead->line);
				FLUSH();
			}
			mwNmlNumAlloc --;
			mwNmlCurAlloc -= mwHead->size;
			mw = mwHead;
			mwUnlink(mw, __FILE__, __LINE__);
			free(mw);
		}
	}

	if (mwNmlNumAlloc) {
		mwWrite("internal: NoMansLand block counter %ld, not zero\n", mwNmlNumAlloc);
	}
	if (mwNmlCurAlloc) {
		mwWrite("internal: NoMansLand byte counter %ld, not zero\n", mwNmlCurAlloc);
	}

	/* report statistics */
	mwStatReport();
	FLUSH();

	mwInited = 0;
	mwHead = mwTail = NULL;
	if (mwErrors) {
		fprintf(mwSTDERR, "MEMWATCH detected %ld anomalies\n", mwErrors);
	}
	mwLogFile(NULL);
	mwErrors = 0;

	MW_MUTEX_TERM();

}